

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tokenizer.cc
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  exception *e;
  int local_30;
  bool local_29;
  int i;
  bool include_ignorable;
  size_t max_len;
  char *filename;
  char **argv_local;
  int argc_local;
  
  QUtil::setLineBuf(_stdout);
  pcVar3 = strrchr(*argv,0x2f);
  if (pcVar3 == (char *)0x0) {
    whoami = *argv;
  }
  else {
    whoami = pcVar3 + 1;
  }
  max_len = 0;
  _i = 0;
  local_29 = true;
  for (local_30 = 1; local_30 < argc; local_30 = local_30 + 1) {
    if (*argv[local_30] == '-') {
      iVar1 = strcmp(argv[local_30],"-maxlen");
      if (iVar1 == 0) {
        local_30 = local_30 + 1;
        if (argc <= local_30) {
          usage();
        }
        uVar2 = QUtil::string_to_uint(argv[local_30]);
        _i = (ulong)uVar2;
      }
      else {
        iVar1 = strcmp(argv[local_30],"-no-ignorable");
        if (iVar1 == 0) {
          local_29 = false;
        }
        else {
          usage();
        }
      }
    }
    else if (max_len == 0) {
      max_len = (size_t)argv[local_30];
    }
    else {
      usage();
    }
  }
  if (max_len == 0) {
    usage();
  }
  process((char *)max_len,local_29,_i);
  return 0;
}

Assistant:

int
main(int argc, char* argv[])
{
    QUtil::setLineBuf(stdout);
    if ((whoami = strrchr(argv[0], '/')) == nullptr) {
        whoami = argv[0];
    } else {
        ++whoami;
    }

    char const* filename = nullptr;
    size_t max_len = 0;
    bool include_ignorable = true;
    for (int i = 1; i < argc; ++i) {
        if (argv[i][0] == '-') {
            if (strcmp(argv[i], "-maxlen") == 0) {
                if (++i >= argc) {
                    usage();
                }
                max_len = QUtil::string_to_uint(argv[i]);
            } else if (strcmp(argv[i], "-no-ignorable") == 0) {
                include_ignorable = false;
            } else {
                usage();
            }
        } else if (filename) {
            usage();
        } else {
            filename = argv[i];
        }
    }
    if (filename == nullptr) {
        usage();
    }

    try {
        process(filename, include_ignorable, max_len);
    } catch (std::exception& e) {
        std::cerr << whoami << ": exception: " << e.what();
        exit(2);
    }
    return 0;
}